

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

void __thiscall Indexing::ClauseCodeTree::LiteralMatcher::recordMatch(LiteralMatcher *this)

{
  LitInfo *pLVar1;
  size_t sVar2;
  ILStruct *this_00;
  
  this_00 = (ILStruct *)(((this->super_Matcher).super_BaseMatcher.op)->_content >> 3);
  CodeTree::ILStruct::ensureFreshness(this_00,((this->super_Matcher).tree)->_curTimeStamp);
  if (this_00->finished != false) {
    return;
  }
  pLVar1 = (this->super_Matcher).linfos;
  sVar2 = (this->super_Matcher).curLInfo;
  if ((this_00->matchCnt == 0) && (pLVar1[sVar2].opposite == true)) {
    this_00->noNonOppositeMatches = true;
  }
  CodeTree::ILStruct::addMatch(this_00,pLVar1[sVar2].liIndex,&(this->super_Matcher).bindings);
  return;
}

Assistant:

void ClauseCodeTree::LiteralMatcher::recordMatch()
{
  ASS(matched());

  ILStruct* ils=op->getILS();
  ils->ensureFreshness(tree->_curTimeStamp);
  if(ils->finished) {
    //no need to record matches which we already know will not lead to anything
    return;
  }
  if(!ils->matchCnt && linfos[curLInfo].opposite) {
    //if we're matching opposite matches, we have already tried all non-opposite ones
    ils->noNonOppositeMatches=true;
  }
  ils->addMatch(linfos[curLInfo].liIndex, bindings);
}